

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.cpp
# Opt level: O0

void TestLogicalOperationNode(void)

{
  initializer_list<std::pair<const_bool,_std::shared_ptr<Node>_>_> __l;
  bool bVar1;
  const_iterator pbVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  byte local_442;
  byte local_42a;
  pair<const_bool,_std::shared_ptr<Node>_> *local_3f0;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  Date local_388;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  Date local_330;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  Date local_2d8;
  char local_2cc [4];
  shared_ptr<EventComparisonNode> local_2c8;
  shared_ptr<Node> local_2b8;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined1 local_29c [20];
  shared_ptr<Node> local_288;
  undefined1 local_278 [8];
  LogicalOperationNode root;
  string local_240;
  bool local_21a;
  allocator<char> local_219;
  string local_218;
  Date local_1f8;
  bool local_1ea;
  allocator<char> local_1e9;
  string local_1e8;
  bool local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  Date local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  LogicalOperationNode and_node;
  LogicalOperationNode or_node;
  bool value_two;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_110;
  initializer_list<bool> *local_100;
  initializer_list<bool> *__range2;
  const_iterator pbStack_f0;
  bool value_one;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> local_d8;
  initializer_list<bool> *local_c8;
  initializer_list<bool> *__range1;
  shared_ptr<EmptyNode> local_b8;
  bool local_a5 [13];
  shared_ptr<FalseNode> local_98;
  bool local_81;
  pair<const_bool,_std::shared_ptr<Node>_> *local_80;
  pair<const_bool,_std::shared_ptr<Node>_> local_78;
  pair<const_bool,_std::shared_ptr<Node>_> local_60;
  iterator local_48;
  element_type *local_40;
  undefined1 local_38 [8];
  map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  bool_to_node;
  
  __range1._7_1_ = 1;
  local_80 = &local_78;
  local_81 = false;
  std::make_shared<FalseNode>();
  std::pair<const_bool,_std::shared_ptr<Node>_>::pair<bool,_std::shared_ptr<FalseNode>,_true>
            (&local_78,&local_81,&local_98);
  local_a5[0] = true;
  local_80 = &local_60;
  std::make_shared<EmptyNode>();
  std::pair<const_bool,_std::shared_ptr<Node>_>::pair<bool,_std::shared_ptr<EmptyNode>,_true>
            (&local_60,local_a5,&local_b8);
  __range1._7_1_ = 0;
  local_48 = &local_78;
  local_40 = (element_type *)0x2;
  std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>::allocator
            ((allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_> *)((long)&__range1 + 5));
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::
  map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  ::map((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
         *)local_38,__l,(less<bool> *)((long)&__range1 + 6),
        (allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_> *)((long)&__range1 + 5));
  std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>::~allocator
            ((allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_> *)((long)&__range1 + 5));
  local_3f0 = (pair<const_bool,_std::shared_ptr<Node>_> *)&local_48;
  do {
    local_3f0 = local_3f0 + -1;
    std::pair<const_bool,_std::shared_ptr<Node>_>::~pair(local_3f0);
  } while (local_3f0 != &local_78);
  std::shared_ptr<EmptyNode>::~shared_ptr(&local_b8);
  std::shared_ptr<FalseNode>::~shared_ptr(&local_98);
  __begin1._6_1_ = 0;
  __begin1._7_1_ = 1;
  local_d8._M_array = (iterator)((long)&__begin1 + 6);
  local_d8._M_len = 2;
  local_c8 = &local_d8;
  __end1 = std::initializer_list<bool>::begin(local_c8);
  pbStack_f0 = std::initializer_list<bool>::end(local_c8);
  for (; __end1 != pbStack_f0; __end1 = __end1 + 1) {
    __range2._7_1_ = *__end1 & 1;
    __begin2._6_1_ = 0;
    __begin2._7_1_ = 1;
    local_110._M_array = (iterator)((long)&__begin2 + 6);
    local_110._M_len = 2;
    local_100 = &local_110;
    __end2 = std::initializer_list<bool>::begin(local_100);
    pbVar2 = std::initializer_list<bool>::end(local_100);
    for (; __end2 != pbVar2; __end2 = __end2 + 1) {
      or_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = *__end2 & 1;
      pmVar3 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[]((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
                             *)local_38,(key_type *)((long)&__range2 + 7));
      pmVar4 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[]((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
                             *)local_38,
                            (key_type *)
                            ((long)&or_node.rhs_node.
                                    super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                    ._M_pi + 7));
      LogicalOperationNode::LogicalOperationNode
                ((LogicalOperationNode *)
                 &and_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,Or,pmVar3,pmVar4);
      pmVar3 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[]((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
                             *)local_38,(key_type *)((long)&__range2 + 7));
      pmVar4 = std::
               map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
               ::operator[]((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
                             *)local_38,
                            (key_type *)
                            ((long)&or_node.rhs_node.
                                    super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                    ._M_pi + 7));
      LogicalOperationNode::LogicalOperationNode
                ((LogicalOperationNode *)local_190,And,pmVar3,pmVar4);
      local_1a0.year = 0;
      local_1a0.month = 0;
      local_1a0.day = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
      local_191 = LogicalOperationNode::Evaluate
                            ((LogicalOperationNode *)
                             &and_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,&local_1a0,&local_1c0);
      local_42a = 1;
      if ((__range2._7_1_ & 1) == 0) {
        local_42a = or_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._7_1_;
      }
      local_1c2 = (bool)(local_42a & 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"LogicalOperationNode Or",&local_1e9);
      AssertEqual<bool,bool>(&local_191,&local_1c2,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      local_1f8.year = 0;
      local_1f8.month = 0;
      local_1f8.day = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"",&local_219);
      local_1ea = LogicalOperationNode::Evaluate
                            ((LogicalOperationNode *)local_190,&local_1f8,&local_218);
      local_442 = 0;
      if ((__range2._7_1_ & 1) != 0) {
        local_442 = or_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._7_1_;
      }
      local_21a = (bool)(local_442 & 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"LogicalOperationNode And",
                 (allocator<char> *)
                 ((long)&root.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      AssertEqual<bool,bool>(&local_1ea,&local_21a,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&root.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      LogicalOperationNode::~LogicalOperationNode((LogicalOperationNode *)local_190);
      LogicalOperationNode::~LogicalOperationNode
                ((LogicalOperationNode *)
                 &and_node.rhs_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
  }
  std::
  map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
  ::~map((map<bool,_std::shared_ptr<Node>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::shared_ptr<Node>_>_>_>
          *)local_38);
  local_29c._0_4_ = 4;
  local_2a8 = 0x7e1;
  local_2a4 = 0xb;
  local_2a0 = 0x12;
  std::make_shared<DateComparisonNode,Comparison,Date>
            ((Comparison *)(local_29c + 4),(Date *)local_29c);
  std::shared_ptr<Node>::shared_ptr<DateComparisonNode,void>
            (&local_288,(shared_ptr<DateComparisonNode> *)(local_29c + 4));
  local_2cc[0] = '\x04';
  local_2cc[1] = '\0';
  local_2cc[2] = '\0';
  local_2cc[3] = '\0';
  std::make_shared<EventComparisonNode,Comparison,char_const(&)[9]>
            ((Comparison *)&local_2c8,(char (*) [9])local_2cc);
  std::shared_ptr<Node>::shared_ptr<EventComparisonNode,void>(&local_2b8,&local_2c8);
  LogicalOperationNode::LogicalOperationNode
            ((LogicalOperationNode *)local_278,And,&local_288,&local_2b8);
  std::shared_ptr<Node>::~shared_ptr(&local_2b8);
  std::shared_ptr<EventComparisonNode>::~shared_ptr(&local_2c8);
  std::shared_ptr<Node>::~shared_ptr(&local_288);
  std::shared_ptr<DateComparisonNode>::~shared_ptr
            ((shared_ptr<DateComparisonNode> *)(local_29c + 4));
  local_2d8.year = 0x7e1;
  local_2d8.month = 0xb;
  local_2d8.day = 0x12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Saturday",&local_2f9);
  bVar1 = LogicalOperationNode::Evaluate((LogicalOperationNode *)local_278,&local_2d8,&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"LogicalOperationNode propagates arguments 1",&local_321);
  Assert(bVar1,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_330.year = 0x7e1;
  local_330.month = 0xb;
  local_330.day = 0x12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"Friday",&local_351);
  bVar1 = LogicalOperationNode::Evaluate((LogicalOperationNode *)local_278,&local_330,&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"LogicalOperationNode propagates arguments 2",&local_379);
  Assert(!bVar1,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  local_388.year = 0x7e1;
  local_388.month = 0xb;
  local_388.day = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"Saturday",&local_3a9);
  bVar1 = LogicalOperationNode::Evaluate((LogicalOperationNode *)local_278,&local_388,&local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"LogicalOperationNode propagates arguments 1",&local_3d1);
  Assert(!bVar1,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  LogicalOperationNode::~LogicalOperationNode((LogicalOperationNode *)local_278);
  return;
}

Assistant:

void TestLogicalOperationNode() {
    {
        map<bool, shared_ptr<Node>> bool_to_node = {
                {false, make_shared<FalseNode>()},
                {true,  make_shared<EmptyNode>()}
        };

        for (bool value_one : {false, true}) {
            for (bool value_two : {false, true}) {
                LogicalOperationNode or_node(
                        LogicalOperation::Or, bool_to_node[value_one], bool_to_node[value_two]
                );
                LogicalOperationNode and_node(
                        LogicalOperation::And, bool_to_node[value_one], bool_to_node[value_two]
                );

                AssertEqual(or_node.Evaluate({}, ""), value_one || value_two, "LogicalOperationNode Or");
                AssertEqual(and_node.Evaluate({}, ""), value_one && value_two, "LogicalOperationNode And");
            }
        }
    }
    {
        LogicalOperationNode root(
                LogicalOperation::And,
                make_shared<DateComparisonNode>(Comparison::Equal, Date{2017, 11, 18}),
                make_shared<EventComparisonNode>(Comparison::Equal, "Saturday")
        );

        Assert(root.Evaluate({2017, 11, 18}, "Saturday"), "LogicalOperationNode propagates arguments 1");
        Assert(!root.Evaluate({2017, 11, 18}, "Friday"), "LogicalOperationNode propagates arguments 2");
        Assert(!root.Evaluate({2017, 11, 1}, "Saturday"), "LogicalOperationNode propagates arguments 1");
    }
}